

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-stats.c
# Opt level: O0

void sexp_print_simple(sexp_conflict ctx,sexp_conflict x,sexp_conflict out,int depth)

{
  sexp psVar1;
  bool bVar2;
  int in_ECX;
  sexp_conflict in_RDX;
  sexp_conflict in_RSI;
  long in_RDI;
  int i;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  
  if ((((((((ulong)in_RSI & 3) != 0) || (((ulong)in_RSI & 0xf) == 6)) ||
        ((((ulong)in_RSI & 3) == 0 && (in_RSI->tag == 7)))) ||
       ((((ulong)in_RSI & 3) == 0 && (in_RSI->tag == 9)))) ||
      ((((ulong)in_RSI & 3) == 0 && (in_RSI->tag == 0xb)))) ||
     ((((ulong)in_RSI & 3) == 0 && (in_RSI->tag == 0xc)))) {
    sexp_write_op(in_RDI,0,2,in_RSI,in_RDX);
    return;
  }
  if (0 < in_ECX) {
    if ((((ulong)in_RSI & 3) == 0) && (in_RSI->tag == 0x16)) {
      if ((in_RDX->value).type.setters == (sexp)0x0) {
        fputs("#<sc ",(FILE *)(in_RDX->value).type.getters);
      }
      else {
        sexp_buffered_write_string(in_RDI,"#<sc ",in_RDX);
      }
      sexp_print_simple(in_RSI,in_RDX,(sexp_conflict)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc);
      if ((in_RDX->value).type.setters != (sexp)0x0) {
        sexp_buffered_write_string(in_RDI,">",in_RDX);
        return;
      }
      fputs(">",(FILE *)(in_RDX->value).type.getters);
      return;
    }
    if ((((ulong)in_RSI & 3) == 0) && (in_RSI->tag == 6)) {
      if ((in_RDX->value).type.setters == (sexp)0x0) {
        putc(0x28,(FILE *)(in_RDX->value).type.getters);
      }
      else if ((in_RDX->value).type.print < (sexp)(in_RDX->value).port.size) {
        psVar1 = (in_RDX->value).type.print;
        (in_RDX->value).type.print = (sexp)((long)&psVar1->tag + 1);
        *(undefined1 *)((long)&psVar1->tag + (long)&((in_RDX->value).type.setters)->tag) = 0x28;
        in_stack_ffffffffffffffdc = 0;
      }
      else {
        in_stack_ffffffffffffffdc = sexp_buffered_write_char(in_RDI,0x28,in_RDX);
      }
      sexp_print_simple(in_RSI,in_RDX,(sexp_conflict)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc);
      if ((in_RDX->value).type.setters == (sexp)0x0) {
        fputs(" . ",(FILE *)(in_RDX->value).type.getters);
      }
      else {
        sexp_buffered_write_string(in_RDI," . ",in_RDX);
      }
      sexp_print_simple(in_RSI,in_RDX,(sexp_conflict)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc);
      if ((in_RDX->value).type.setters != (sexp)0x0) {
        if ((in_RDX->value).type.print < (sexp)(in_RDX->value).port.size) {
          psVar1 = (in_RDX->value).type.print;
          (in_RDX->value).type.print = (sexp)((long)&psVar1->tag + 1);
          *(undefined1 *)((long)&psVar1->tag + (long)&((in_RDX->value).type.setters)->tag) = 0x29;
          return;
        }
        sexp_buffered_write_char(in_RDI,0x29,in_RDX);
        return;
      }
      putc(0x29,(FILE *)(in_RDX->value).type.getters);
      return;
    }
    if ((((ulong)in_RSI & 3) == 0) && (in_RSI->tag == 10)) {
      if ((in_RDX->value).type.setters == (sexp)0x0) {
        fputs("#(",(FILE *)(in_RDX->value).type.getters);
      }
      else {
        sexp_buffered_write_string(in_RDI,"#(",in_RDX);
      }
      iVar3 = 0;
      while( true ) {
        bVar2 = false;
        if (iVar3 < 1) {
          bVar2 = iVar3 < (int)(in_RSI->value).vector.length;
        }
        if (!bVar2) break;
        if (0 < iVar3) {
          if ((in_RDX->value).type.setters == (sexp)0x0) {
            putc(0x20,(FILE *)(in_RDX->value).type.getters);
          }
          else if ((in_RDX->value).type.print < (sexp)(in_RDX->value).port.size) {
            psVar1 = (in_RDX->value).type.print;
            (in_RDX->value).type.print = (sexp)((long)&psVar1->tag + 1);
            *(undefined1 *)((long)&psVar1->tag + (long)&((in_RDX->value).type.setters)->tag) = 0x20;
          }
          else {
            sexp_buffered_write_char(in_RDI,0x20,in_RDX);
          }
        }
        sexp_print_simple(in_RSI,in_RDX,(sexp_conflict)CONCAT44(in_ECX,iVar3),
                          in_stack_ffffffffffffffdc);
        iVar3 = iVar3 + 1;
      }
      if (iVar3 < (int)(in_RSI->value).vector.length) {
        if ((in_RDX->value).type.setters == (sexp)0x0) {
          fputs(" ...",(FILE *)(in_RDX->value).type.getters);
        }
        else {
          sexp_buffered_write_string(in_RDI," ...",in_RDX);
        }
      }
      if ((in_RDX->value).type.setters != (sexp)0x0) {
        if ((in_RDX->value).type.print < (sexp)(in_RDX->value).port.size) {
          psVar1 = (in_RDX->value).type.print;
          (in_RDX->value).type.print = (sexp)((long)&psVar1->tag + 1);
          *(undefined1 *)((long)&psVar1->tag + (long)&((in_RDX->value).type.setters)->tag) = 0x29;
          return;
        }
        sexp_buffered_write_char(in_RDI,0x29,in_RDX);
        return;
      }
      putc(0x29,(FILE *)(in_RDX->value).type.getters);
      return;
    }
  }
  if ((in_RDX->value).type.setters == (sexp)0x0) {
    fputs("#<",(FILE *)(in_RDX->value).type.getters);
  }
  else {
    sexp_buffered_write_string(in_RDI,"#<",in_RDX);
  }
  sexp_write_op(in_RDI,0,2,
                *(undefined8 *)
                 (*(long *)(*(long *)(*(long *)(in_RDI + 0x28) + 0x20) + 0x10 +
                           (ulong)in_RSI->tag * 8) + 8),in_RDX);
  if ((in_RDX->value).type.setters == (sexp)0x0) {
    fputs(">",(FILE *)(in_RDX->value).type.getters);
  }
  else {
    sexp_buffered_write_string(in_RDI,">",in_RDX);
  }
  return;
}

Assistant:

static void sexp_print_simple (sexp ctx, sexp x, sexp out, int depth) {
  int i;
  if ((!sexp_pointerp(x)) || sexp_symbolp(x) || sexp_stringp(x)
      || sexp_flonump(x) || sexp_bignump(x)) {
    sexp_write(ctx, x, out);
  } else if (depth <= 0) {
    goto print_name;
  } else if (sexp_synclop(x)) {
    sexp_write_string(ctx, "#<sc ", out);
    sexp_print_simple(ctx, sexp_synclo_expr(x), out, depth);
    sexp_write_string(ctx, ">", out);
  } else if (sexp_pairp(x)) {
    sexp_write_char(ctx, '(', out);
    sexp_print_simple(ctx, sexp_car(x), out, depth-1);
    sexp_write_string(ctx, " . ", out);
    sexp_print_simple(ctx, sexp_cdr(x), out, depth-1);
    sexp_write_char(ctx, ')', out);
  } else if (sexp_vectorp(x)) {
    sexp_write_string(ctx, "#(", out);
    for (i=0; i<SEXP_HEAP_VECTOR_DEPTH && i<(int)sexp_vector_length(x); i++) {
      if (i>0)
        sexp_write_char(ctx, ' ', out);
      sexp_print_simple(ctx, sexp_vector_ref(x, i), out, depth-1);
    }
    if (i<(int)sexp_vector_length(x))
      sexp_write_string(ctx, " ...", out);
    sexp_write_char(ctx, ')', out);
  } else {
  print_name:
    sexp_write_string(ctx, "#<", out);
    sexp_write(ctx, sexp_object_type_name(ctx, x), out);
    sexp_write_string(ctx, ">", out);
  }
}